

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_jmp(function *fn,int A,int sBx,int pc)

{
  int pc_local;
  int sBx_local;
  int A_local;
  function *fn_local;
  
  if (0 < A) {
    membuff_add_fstring(&fn->body,"ra = R(%d);\n",(ulong)(A - 1));
    membuff_add_string(&fn->body,"luaF_close(L, ra, LUA_OK);\n");
    membuff_add_string(&fn->body,"base = ci->u.l.base;\n");
  }
  membuff_add_fstring(&fn->body,"goto Lbc_%d;\n",(ulong)(uint)sBx);
  return;
}

Assistant:

static void emit_op_jmp(struct function *fn, int A, int sBx, int pc) {
  (void)pc;
  if (A > 0) {
    membuff_add_fstring(&fn->body, "ra = R(%d);\n", A - 1);
#ifdef RAVI_DEFER_STATEMENT
    membuff_add_string(&fn->body, "luaF_close(L, ra, LUA_OK);\n");
    membuff_add_string(&fn->body, "base = ci->u.l.base;\n");
#else
    membuff_add_string(&fn->body, "luaF_close(L, ra);\n");
#endif
  }
  membuff_add_fstring(&fn->body, "goto Lbc_%d;\n", sBx);
}